

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial.c
# Opt level: O0

void solv_partial(Item *qsol,Symbol *fun)

{
  uint uVar1;
  long in_RSI;
  Symbol *dspace;
  Item *q;
  int ident;
  int i;
  char *in_stack_00001f98;
  char *in_stack_00001fa0;
  char *in_stack_00001fa8;
  Symbol *in_stack_00001fb0;
  char *in_stack_ffffffffffffff98;
  char *s;
  Item *in_stack_ffffffffffffffa0;
  Item *q_00;
  undefined8 in_stack_ffffffffffffffa8;
  int t;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Symbol *local_38;
  Item *local_30;
  int local_24;
  
  t = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_38 = lookup(in_stack_ffffffffffffff98);
  if (local_38 == (Symbol *)0x0) {
    local_38 = install((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),t);
    parminstall(in_stack_00001fb0,in_stack_00001fa8,in_stack_00001fa0,in_stack_00001f98);
  }
  sprintf(buf,"%s();\n",*(undefined8 *)(in_RSI + 0x48));
  replacstr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  save_dt(partialcolon);
  for (local_30 = parinfo->next; local_30 != parinfo; local_30 = local_30->next) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      *(anon_union_8_4_46e41722_for_element *)(pv + local_24) = local_30->element;
      local_30 = local_30->next;
    }
    partialcolon = (local_30->element).itm;
    uVar1 = (uint)local_30->itemtype;
    s = indepsym->name;
    q_00 = (Item *)local_38->name;
    sprintf(buf,
            "if (error=crank(%d, %s, %s, %s, delta_%s, %s, %s, _pbound%d, &_parwork%d))return error;\n"
            ,(ulong)(uint)pv[2]->araydim,pv[2]->name,pv[1]->name,pv[3]->name,s,q_00,indepsym->name,
            uVar1,uVar1);
    replacstr(q_00,s);
    sprintf(buf,"static double *_pbound%d[4], _bnd%d_0, _bnd%d_N, *_parwork%d;\n",(ulong)uVar1,
            (ulong)uVar1,(ulong)uVar1,(ulong)uVar1);
    linsertstr(q_00,s);
  }
  return;
}

Assistant:

void solv_partial(qsol, fun)
	Item *qsol;
	Symbol *fun;
{
	int i, ident;
	Item *q;
	Symbol *dspace;
	
	if ((dspace = lookup("delta_x")) == SYM0) {
		dspace = install("delta_x", NAME);
		parminstall(dspace, "1", "");
	}
	Sprintf(buf, "%s();\n", fun->name);
	replacstr(qsol, buf);
	save_dt(partialcolon);
   ITERATE(q, parinfo) {
	for (i=0; i<4; i++) {
		pv[i] = SYM(q);
		q = q->next;
	}
	partialcolon = ITM(q);
	ident = q->itemtype;
	
Sprintf(buf, "if (error=crank(%d, %s, %s, %s, delta_%s, %s, %s, _pbound%d, &_parwork%d))return error;\n",
	pv[2]->araydim, pv[2]->name, pv[1]->name, pv[3]->name,
	indepsym->name, dspace->name, indepsym->name, ident, ident);
	replacstr(partialcolon, buf);
	Sprintf(buf, "static double *_pbound%d[4], _bnd%d_0, _bnd%d_N, *_parwork%d;\n",
		ident, ident, ident, ident);
	Linsertstr(procfunc, buf);
   }
}